

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.hpp
# Opt level: O2

Instruction *
Instruction::createArithmetic
          (Instruction *__return_storage_ptr__,int id,char type,int dest,int src1,int src2)

{
  int iVar1;
  InstructionType IVar2;
  ulong uVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  
  __return_storage_ptr__->addr = 0;
  __return_storage_ptr__->condition = 0;
  __return_storage_ptr__->src = 0;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->issued_cycle = -1;
  __return_storage_ptr__->executed_cycle = -1;
  __return_storage_ptr__->written_cycle = -1;
  iVar1 = (int)CONCAT71(in_register_00000011,type);
  uVar3 = (ulong)(iVar1 - 0x4aU);
  if (iVar1 - 0x4aU < 10) {
    uVar4 = (long)&switchD_00106c9e::switchdataD_0010a070 +
            (long)(int)(&switchD_00106c9e::switchdataD_0010a070)[uVar3];
    switch(uVar3) {
    case 0:
      IVar2 = JUMP;
      break;
    default:
switchD_00106c9e_caseD_1:
      fprintf(_stderr,"\x1b[31mError in file %s on line %d: ",
              "/workspace/llm4binary/github/license_all_cmakelists_25/LyricZhao[P]TomasuloSimulator/instruction.hpp"
              ,0x1b,src1,src2,uVar4);
      fprintf(_stderr,"No such instruction type %c",(ulong)(uint)(int)type);
      fwrite("\x1b[0m",4,1,_stderr);
      fflush(_stderr);
      exit(1);
    case 2:
      IVar2 = LOAD;
      break;
    case 3:
      IVar2 = MUL;
      break;
    case 9:
      IVar2 = SUB;
    }
  }
  else if (iVar1 == 0x41) {
    IVar2 = ADD;
  }
  else {
    uVar4 = uVar3;
    if (iVar1 != 0x44) goto switchD_00106c9e_caseD_1;
    IVar2 = DIV;
  }
  __return_storage_ptr__->type = IVar2;
  __return_storage_ptr__->id = id;
  __return_storage_ptr__->dest = dest;
  __return_storage_ptr__->src1 = src1;
  __return_storage_ptr__->src2 = src2;
  return __return_storage_ptr__;
}

Assistant:

static Instruction createArithmetic(int id, char type, int dest, int src1, int src2) {
        Instruction instruction{};
        instruction.type = getType(type);
        instruction.id = id;
        instruction.dest = dest;
        instruction.src1 = src1;
        instruction.src2 = src2;

        return instruction;
    }